

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

double __thiscall
tetgenmesh::insphere_s(tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double *pe)

{
  int iVar1;
  double *pd_00;
  undefined4 *puVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  point pt [5];
  double *local_58 [5];
  
  dVar10 = insphere(pa,pb,pc,pd,pe);
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    local_58[1] = pb;
    local_58[2] = pc;
    local_58[3] = pd;
    local_58[4] = pe;
    iVar1 = this->pointmarkindex;
    iVar3 = 5;
    uVar5 = 0;
    lVar4 = 0x20;
    local_58[0] = pa;
    do {
      if (iVar3 < 2) break;
      iVar3 = iVar3 + -1;
      lVar7 = 0;
      iVar6 = 0;
      pdVar8 = local_58[0];
      do {
        pdVar9 = *(double **)((long)local_58 + lVar7 + 8);
        if (*(int *)((long)pdVar9 + (long)iVar1 * 4) < *(int *)((long)pdVar8 + (long)iVar1 * 4)) {
          *(double **)((long)local_58 + lVar7) = pdVar9;
          *(double **)((long)local_58 + lVar7 + 8) = pdVar8;
          iVar6 = iVar6 + 1;
          pdVar9 = pdVar8;
        }
        lVar7 = lVar7 + 8;
        pdVar8 = pdVar9;
      } while (lVar4 != lVar7);
      uVar5 = uVar5 + iVar6;
      lVar4 = lVar4 + -8;
    } while (0 < iVar6);
    pd_00 = local_58[4];
    pdVar9 = local_58[3];
    pdVar8 = local_58[2];
    dVar10 = orient3d(local_58[1],local_58[2],local_58[3],local_58[4]);
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      if ((uVar5 & 1) == 0) {
        return dVar10;
      }
    }
    else {
      dVar10 = orient3d(local_58[0],pdVar8,pdVar9,pd_00);
      if ((dVar10 == 0.0) && (!NAN(dVar10))) {
        puVar2 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar2 = 2;
        __cxa_throw(puVar2,&int::typeinfo,0);
      }
      if ((uVar5 & 1) != 0) {
        return dVar10;
      }
    }
    dVar10 = -dVar10;
  }
  return dVar10;
}

Assistant:

REAL tetgenmesh::insphere_s(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe)
{
  REAL sign;

  sign = insphere(pa, pb, pc, pd, pe);
  if (sign != 0.0) {
    return sign;
  }

  // Symbolic perturbation.
  point pt[5], swappt;
  REAL oriA, oriB;
  int swaps, count;
  int n, i;

  pt[0] = pa;
  pt[1] = pb;
  pt[2] = pc;
  pt[3] = pd;
  pt[4] = pe;
  
  // Sort the five points such that their indices are in the increasing
  //   order. An optimized bubble sort algorithm is used, i.e., it has
  //   the worst case O(n^2) runtime, but it is usually much faster.
  swaps = 0; // Record the total number of swaps.
  n = 5;
  do {
    count = 0;
    n = n - 1;
    for (i = 0; i < n; i++) {
      if (pointmark(pt[i]) > pointmark(pt[i+1])) {
        swappt = pt[i]; pt[i] = pt[i+1]; pt[i+1] = swappt;
        count++;
      }
    }
    swaps += count;
  } while (count > 0); // Continue if some points are swapped.

  oriA = orient3d(pt[1], pt[2], pt[3], pt[4]);
  if (oriA != 0.0) {
    // Flip the sign if there are odd number of swaps.
    if ((swaps % 2) != 0) oriA = -oriA;
    return oriA;
  }
  
  oriB = -orient3d(pt[0], pt[2], pt[3], pt[4]);
  if (oriB == 0.0) {
    terminatetetgen(this, 2);
  }
  // Flip the sign if there are odd number of swaps.
  if ((swaps % 2) != 0) oriB = -oriB;
  return oriB;
}